

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O2

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitAtomicRMW
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,AtomicRMW *curr)

{
  if (((curr->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.type.id &
      0xfffffffffffffffe) == 2) {
    notePointer(this,&curr->ptr,(Name)(curr->memory).super_IString.str);
    IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
              ((ConstraintCollector *)this,&curr->value,
               (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.
                     type.id);
    return;
  }
  __assert_fail("curr->type == Type::i32 || curr->type == Type::i64",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                ,200,
                "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitAtomicRMW(AtomicRMW *) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
               );
}

Assistant:

void visitAtomicRMW(AtomicRMW* curr) {
    assert(curr->type == Type::i32 || curr->type == Type::i64);
    notePointer(&curr->ptr, curr->memory);
    note(&curr->value, curr->type);
  }